

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableStringFieldGenerator::GenerateKotlinDslMembers
          (RepeatedImmutableStringFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "/**\n * An uninstantiable, behaviorless type to represent the field in\n * generics.\n */\n@kotlin.OptIn(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\npublic class ${$$kt_capitalized_name$Proxy$}$ private constructor() : com.google.protobuf.kotlin.DslProxy()\n"
                    );
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_GETTER,false);
  io::Printer::Print(printer,variables,
                     "$kt_deprecation$public val $kt_name$: com.google.protobuf.kotlin.DslList<kotlin.String, ${$$kt_capitalized_name$Proxy$}$>\n  @kotlin.jvm.JvmSynthetic\n  get() = com.google.protobuf.kotlin.DslList(\n    $kt_dsl_builder$.${$get$capitalized_name$List$}$()\n  )\n"
                    );
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_ADDER,false);
  io::Printer::Print(printer,variables,
                     "@kotlin.jvm.JvmSynthetic\n@kotlin.jvm.JvmName(\"add$kt_capitalized_name$\")\npublic fun com.google.protobuf.kotlin.DslList<kotlin.String, ${$$kt_capitalized_name$Proxy$}$>.add(value: kotlin.String) {\n  $kt_dsl_builder$.${$add$capitalized_name$$}$(value)\n}\n"
                    );
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_ADDER,false);
  io::Printer::Print(printer,variables,
                     "@kotlin.jvm.JvmSynthetic\n@kotlin.jvm.JvmName(\"plusAssign$kt_capitalized_name$\")\n@Suppress(\"NOTHING_TO_INLINE\")\npublic inline operator fun com.google.protobuf.kotlin.DslList<kotlin.String, ${$$kt_capitalized_name$Proxy$}$>.plusAssign(value: kotlin.String) {\n  add(value)\n}\n"
                    );
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_MULTI_ADDER,false);
  io::Printer::Print(printer,variables,
                     "@kotlin.jvm.JvmSynthetic\n@kotlin.jvm.JvmName(\"addAll$kt_capitalized_name$\")\npublic fun com.google.protobuf.kotlin.DslList<kotlin.String, ${$$kt_capitalized_name$Proxy$}$>.addAll(values: kotlin.collections.Iterable<kotlin.String>) {\n  $kt_dsl_builder$.${$addAll$capitalized_name$$}$(values)\n}\n"
                    );
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_MULTI_ADDER,false);
  io::Printer::Print(printer,variables,
                     "@kotlin.jvm.JvmSynthetic\n@kotlin.jvm.JvmName(\"plusAssignAll$kt_capitalized_name$\")\n@Suppress(\"NOTHING_TO_INLINE\")\npublic inline operator fun com.google.protobuf.kotlin.DslList<kotlin.String, ${$$kt_capitalized_name$Proxy$}$>.plusAssign(values: kotlin.collections.Iterable<kotlin.String>) {\n  addAll(values)\n}\n"
                    );
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_INDEXED_SETTER,false);
  io::Printer::Print(printer,variables,
                     "@kotlin.jvm.JvmSynthetic\n@kotlin.jvm.JvmName(\"set$kt_capitalized_name$\")\npublic operator fun com.google.protobuf.kotlin.DslList<kotlin.String, ${$$kt_capitalized_name$Proxy$}$>.set(index: kotlin.Int, value: kotlin.String) {\n  $kt_dsl_builder$.${$set$capitalized_name$$}$(index, value)\n}"
                    );
  WriteFieldAccessorDocComment(printer,this->descriptor_,CLEARER,false);
  io::Printer::Print(printer,variables,
                     "@kotlin.jvm.JvmSynthetic\n@kotlin.jvm.JvmName(\"clear$kt_capitalized_name$\")\npublic fun com.google.protobuf.kotlin.DslList<kotlin.String, ${$$kt_capitalized_name$Proxy$}$>.clear() {\n  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n}"
                    );
  return;
}

Assistant:

void RepeatedImmutableStringFieldGenerator::GenerateKotlinDslMembers(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "/**\n"
      " * An uninstantiable, behaviorless type to represent the field in\n"
      " * generics.\n"
      " */\n"
      "@kotlin.OptIn"
      "(com.google.protobuf.kotlin.OnlyForUseByGeneratedProtoCode::class)\n"
      "public class ${$$kt_capitalized_name$Proxy$}$ private constructor()"
      " : com.google.protobuf.kotlin.DslProxy()\n");

  // property for List<String>
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER);
  printer->Print(variables_,
                 "$kt_deprecation$public val $kt_name$: "
                 "com.google.protobuf.kotlin.DslList"
                 "<kotlin.String, ${$$kt_capitalized_name$Proxy$}$>\n"
                 "  @kotlin.jvm.JvmSynthetic\n"
                 "  get() = com.google.protobuf.kotlin.DslList(\n"
                 "    $kt_dsl_builder$.${$get$capitalized_name$List$}$()\n"
                 "  )\n");

  // List<String>.add(String)
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_ADDER,
                               /* builder */ false);
  printer->Print(variables_,
                 "@kotlin.jvm.JvmSynthetic\n"
                 "@kotlin.jvm.JvmName(\"add$kt_capitalized_name$\")\n"
                 "public fun com.google.protobuf.kotlin.DslList"
                 "<kotlin.String, ${$$kt_capitalized_name$Proxy$}$>."
                 "add(value: kotlin.String) {\n"
                 "  $kt_dsl_builder$.${$add$capitalized_name$$}$(value)\n"
                 "}\n");

  // List<String> += String
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_ADDER,
                               /* builder */ false);
   printer->Print(variables_,
                 "@kotlin.jvm.JvmSynthetic\n"
                 "@kotlin.jvm.JvmName(\"plusAssign$kt_capitalized_name$\")\n"
                 "@Suppress(\"NOTHING_TO_INLINE\")\n"
                 "public inline operator fun com.google.protobuf.kotlin.DslList"
                 "<kotlin.String, ${$$kt_capitalized_name$Proxy$}$>."
                 "plusAssign(value: kotlin.String) {\n"
                 "  add(value)\n"
                 "}\n");

  // List<String>.addAll(Iterable<String>)
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_MULTI_ADDER,
                               /* builder */ false);
  printer->Print(
      variables_,
      "@kotlin.jvm.JvmSynthetic\n"
      "@kotlin.jvm.JvmName(\"addAll$kt_capitalized_name$\")\n"
      "public fun com.google.protobuf.kotlin.DslList"
      "<kotlin.String, ${$$kt_capitalized_name$Proxy$}$>."
      "addAll(values: kotlin.collections.Iterable<kotlin.String>) {\n"
      "  $kt_dsl_builder$.${$addAll$capitalized_name$$}$(values)\n"
      "}\n");

  // List<String> += Iterable<String>
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_MULTI_ADDER,
                               /* builder */ false);
  printer->Print(
      variables_,
      "@kotlin.jvm.JvmSynthetic\n"
      "@kotlin.jvm.JvmName(\"plusAssignAll$kt_capitalized_name$\")\n"
      "@Suppress(\"NOTHING_TO_INLINE\")\n"
      "public inline operator fun com.google.protobuf.kotlin.DslList"
      "<kotlin.String, ${$$kt_capitalized_name$Proxy$}$>."
      "plusAssign(values: kotlin.collections.Iterable<kotlin.String>) {\n"
      "  addAll(values)\n"
      "}\n");

  // List<String>[Int] = String
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_SETTER,
                               /* builder */ false);
  printer->Print(
      variables_,
      "@kotlin.jvm.JvmSynthetic\n"
      "@kotlin.jvm.JvmName(\"set$kt_capitalized_name$\")\n"
      "public operator fun com.google.protobuf.kotlin.DslList"
      "<kotlin.String, ${$$kt_capitalized_name$Proxy$}$>."
      "set(index: kotlin.Int, value: kotlin.String) {\n"
      "  $kt_dsl_builder$.${$set$capitalized_name$$}$(index, value)\n"
      "}");

  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               /* builder */ false);
  printer->Print(variables_,
                 "@kotlin.jvm.JvmSynthetic\n"
                 "@kotlin.jvm.JvmName(\"clear$kt_capitalized_name$\")\n"
                 "public fun com.google.protobuf.kotlin.DslList"
                 "<kotlin.String, ${$$kt_capitalized_name$Proxy$}$>."
                 "clear() {\n"
                 "  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n"
                 "}");
}